

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

uint8_t * __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getBCD
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,int8_t *sign,
          int32_t *exponent,ValueLength *mantissaLength)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  uint uVar4;
  undefined8 uVar5;
  ulong uVar6;
  unsigned_long uVar7;
  uint8_t *puVar8;
  int iVar9;
  unsigned_long *in_RCX;
  uint *in_RDX;
  undefined1 *in_RSI;
  Exception *in_RDI;
  bool bVar10;
  uint64_t mlenlen;
  bool positive;
  uint64_t type;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar11;
  uint8_t *in_stack_ffffffffffffffb8;
  
  bVar1 = isBCD((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x120747);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    bVar2 = head((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x120798);
    uVar6 = (ulong)bVar2;
    bVar10 = 199 < uVar6;
    bVar1 = uVar6 < 0xd0;
    uVar11 = bVar10 && bVar1;
    iVar9 = 0xcf;
    if (bVar10 && bVar1) {
      iVar9 = 199;
    }
    uVar3 = 0xff;
    if (bVar10 && bVar1) {
      uVar3 = 1;
    }
    *in_RSI = uVar3;
    valueStart((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               CONCAT17(uVar11,in_stack_ffffffffffffffb0));
    uVar4 = readIntegerFixed<unsigned_int,4ul>((uint8_t *)0x120829);
    *in_RDX = uVar4;
    valueStart((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
               CONCAT17(uVar11,in_stack_ffffffffffffffb0));
    uVar7 = readIntegerNonEmpty<unsigned_long>
                      (in_stack_ffffffffffffffb8,CONCAT17(uVar11,in_stack_ffffffffffffffb0));
    *in_RCX = uVar7;
    puVar8 = valueStart((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                        CONCAT17(uVar11,in_stack_ffffffffffffffb0));
    return puVar8 + (uVar6 - (long)iVar9) + 5;
  }
  uVar5 = __cxa_allocate_exception(0x18);
  Exception::Exception
            (in_RDI,(ExceptionType)((ulong)uVar5 >> 0x20),
             (char *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  __cxa_throw(uVar5,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

uint8_t const* getBCD(int8_t& sign, int32_t& exponent,
                        ValueLength& mantissaLength) const {
    if (VELOCYPACK_UNLIKELY(!isBCD())) {
      throw Exception(Exception::InvalidValueType, "Expecting type BCD");
    }

    uint64_t type = head();
    bool positive = type >= 0xc8 && type <= 0xcf;
    uint64_t mlenlen = type - (positive ? 0xc7 : 0xcf);

    sign = positive ? 1 : -1;
    exponent = static_cast<int32_t>(
        readIntegerFixed<uint32_t, 4>(valueStart() + 1 + mlenlen));
    mantissaLength =
        readIntegerNonEmpty<ValueLength>(valueStart() + 1, mlenlen);

    return valueStart() + 1 + mlenlen + 4;
  }